

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  TestCase *pTVar5;
  int width;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  TimeInMillis ms;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  int local_d4;
  undefined1 local_d0 [8];
  string kTestsuites;
  string kIndent;
  undefined1 local_70 [8];
  tm time_struct;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"testsuites",(allocator<char> *)local_70);
  Indent_abi_cxx11_((string *)((long)&kTestsuites.field_2 + 8),(internal *)0x2,width);
  std::operator<<(stream,"{\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"tests",(allocator<char> *)(kIndent.field_2._M_local_buf + 8));
  iVar2 = UnitTest::reportable_test_count(unit_test);
  OutputJsonKey(stream,(string *)local_d0,(string *)local_70,iVar2,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"failures",(allocator<char> *)(kIndent.field_2._M_local_buf + 8));
  iVar2 = UnitTest::failed_test_count(unit_test);
  OutputJsonKey(stream,(string *)local_d0,(string *)local_70,iVar2,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"disabled",(allocator<char> *)(kIndent.field_2._M_local_buf + 8));
  iVar2 = UnitTest::reportable_disabled_test_count(unit_test);
  OutputJsonKey(stream,(string *)local_d0,(string *)local_70,iVar2,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"errors",(allocator<char> *)(kIndent.field_2._M_local_buf + 8));
  OutputJsonKey(stream,(string *)local_d0,(string *)local_70,0,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  std::__cxx11::string::~string((string *)local_70);
  if (FLAGS_gtest_shuffle == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,"random_seed",
               (allocator<char> *)(kIndent.field_2._M_local_buf + 8));
    OutputJsonKey(stream,(string *)local_d0,(string *)local_70,unit_test->impl_->random_seed_,
                  (string *)((long)&kTestsuites.field_2 + 8),true);
    std::__cxx11::string::~string((string *)local_70);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"timestamp",(allocator<char> *)((long)&time_struct.tm_zone + 7));
  bVar1 = PortableLocaltime(unit_test->impl_->start_timestamp_ / 1000,(tm *)local_70);
  if (bVar1) {
    local_d4 = time_struct.tm_mday + 0x76c;
    StreamableToString<int>(&local_218,&local_d4);
    std::operator+(&local_238,&local_218,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_1f8,(String *)(ulong)(time_struct.tm_hour + 1),value);
    std::operator+(&local_258,&local_238,&local_1f8);
    std::operator+(&local_278,&local_258,"-");
    String::FormatIntWidth2_abi_cxx11_
              (&local_1d8,(String *)(ulong)(uint)time_struct.tm_min,value_00);
    std::operator+(&local_298,&local_278,&local_1d8);
    std::operator+(&local_2b8,&local_298,"T");
    String::FormatIntWidth2_abi_cxx11_
              (&local_1b8,(String *)(ulong)(uint)time_struct.tm_sec,value_01);
    std::operator+(&local_2d8,&local_2b8,&local_1b8);
    std::operator+(&local_2f8,&local_2d8,":");
    String::FormatIntWidth2_abi_cxx11_(&local_198,(String *)(ulong)(uint)local_70._4_4_,value_02);
    std::operator+(&local_138,&local_2f8,&local_198);
    std::operator+(&local_f8,&local_138,":");
    String::FormatIntWidth2_abi_cxx11_(&local_178,(String *)(ulong)(uint)local_70._0_4_,value_03);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&kIndent.field_2 + 8),&local_f8,&local_178);
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&kIndent.field_2 + 8),"Z");
    std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"",(allocator<char> *)(kIndent.field_2._M_local_buf + 8));
  }
  OutputJsonKey(stream,(string *)local_d0,&local_158,&local_118,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"time",(allocator<char> *)&local_f8);
  FormatTimeInMillisAsDuration_abi_cxx11_
            ((string *)((long)&kIndent.field_2 + 8),(internal *)unit_test->impl_->elapsed_time_,ms);
  OutputJsonKey(stream,(string *)local_d0,(string *)local_70,(string *)((long)&kIndent.field_2 + 8),
                (string *)((long)&kTestsuites.field_2 + 8),false);
  std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_70);
  TestPropertiesAsJson
            ((string *)local_70,&unit_test->impl_->ad_hoc_test_result_,
             (string *)((long)&kTestsuites.field_2 + 8));
  poVar4 = std::operator<<(stream,(string *)local_70);
  std::operator<<(poVar4,",\n");
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"name",(allocator<char> *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(kIndent.field_2._M_local_buf + 8),"AllTests",(allocator<char> *)&local_138);
  OutputJsonKey(stream,(string *)local_d0,(string *)local_70,(string *)((long)&kIndent.field_2 + 8),
                (string *)((long)&kTestsuites.field_2 + 8),true);
  std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_70);
  poVar4 = std::operator<<(stream,(string *)(kTestsuites.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,(string *)local_d0);
  std::operator<<(poVar4,"\": [\n");
  bVar1 = false;
  for (iVar2 = 0;
      iVar2 < (int)((ulong)((long)(unit_test->impl_->test_cases_).
                                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(unit_test->impl_->test_cases_).
                                 super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3); iVar2 = iVar2 + 1
      ) {
    pTVar5 = UnitTest::GetTestCase(unit_test,iVar2);
    iVar3 = TestCase::reportable_test_count(pTVar5);
    if (0 < iVar3) {
      if (bVar1) {
        std::operator<<(stream,",\n");
      }
      pTVar5 = UnitTest::GetTestCase(unit_test,iVar2);
      bVar1 = true;
      PrintJsonTestCase(stream,pTVar5);
    }
  }
  poVar4 = std::operator<<(stream,"\n");
  poVar4 = std::operator<<(poVar4,(string *)(kTestsuites.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4,"]\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::string::~string((string *)(kTestsuites.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_d0);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestCase(stream, *unit_test.GetTestCase(i));
    }
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}